

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O2

void png_do_invert(png_row_infop row_info,png_bytep row)

{
  png_size_t pVar1;
  ulong uVar2;
  png_size_t pVar3;
  ulong uVar4;
  
  if (row_info->color_type == '\x04') {
    if (row_info->bit_depth == '\x10') {
      uVar2 = row_info->rowbytes;
      for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 4) {
        row[uVar4] = ~row[uVar4];
        row[uVar4 + 1] = ~row[uVar4 + 1];
      }
    }
    else if (row_info->bit_depth == '\b') {
      uVar2 = row_info->rowbytes;
      for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 2) {
        row[uVar4] = ~row[uVar4];
      }
    }
  }
  else if (row_info->color_type == '\0') {
    pVar1 = row_info->rowbytes;
    for (pVar3 = 0; pVar1 != pVar3; pVar3 = pVar3 + 1) {
      row[pVar3] = ~row[pVar3];
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_invert(png_row_infop row_info, png_bytep row)
{
   png_debug(1, "in png_do_invert");

  /* This test removed from libpng version 1.0.13 and 1.2.0:
   *   if (row_info->bit_depth == 1 &&
   */
   if (row_info->color_type == PNG_COLOR_TYPE_GRAY)
   {
      png_bytep rp = row;
      png_size_t i;
      png_size_t istop = row_info->rowbytes;

      for (i = 0; i < istop; i++)
      {
         *rp = (png_byte)(~(*rp));
         rp++;
      }
   }

   else if (row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA &&
      row_info->bit_depth == 8)
   {
      png_bytep rp = row;
      png_size_t i;
      png_size_t istop = row_info->rowbytes;

      for (i = 0; i < istop; i += 2)
      {
         *rp = (png_byte)(~(*rp));
         rp += 2;
      }
   }

#ifdef PNG_16BIT_SUPPORTED
   else if (row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA &&
      row_info->bit_depth == 16)
   {
      png_bytep rp = row;
      png_size_t i;
      png_size_t istop = row_info->rowbytes;

      for (i = 0; i < istop; i += 4)
      {
         *rp = (png_byte)(~(*rp));
         *(rp + 1) = (png_byte)(~(*(rp + 1)));
         rp += 4;
      }
   }
#endif
}